

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void flatbuffers::anon_unknown_0::SwapSerializedTables
               (Offset<flatbuffers::Table> *a,Offset<flatbuffers::Table> *b)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  uoffset_t udiff;
  ptrdiff_t diff;
  Offset<flatbuffers::Table> *b_local;
  Offset<flatbuffers::Table> *a_local;
  
  lVar3 = ((long)b - (long)a >> 2) << 2;
  if (-1 < lVar3) {
    iVar1 = (int)lVar3;
    uVar2 = ReadScalar<unsigned_int>(a);
    uVar2 = EndianScalar<unsigned_int>(uVar2 - iVar1);
    a->o = uVar2;
    uVar2 = ReadScalar<unsigned_int>(b);
    uVar2 = EndianScalar<unsigned_int>(uVar2 + iVar1);
    b->o = uVar2;
    std::swap<flatbuffers::Offset<flatbuffers::Table>>(a,b);
    return;
  }
  __assert_fail("diff >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                ,0x106,
                "void flatbuffers::(anonymous namespace)::SwapSerializedTables(Offset<Table> *, Offset<Table> *)"
               );
}

Assistant:

static void SwapSerializedTables(Offset<Table> *a, Offset<Table> *b) {
  // These are serialized offsets, so are relative where they are
  // stored in memory, so compute the distance between these pointers:
  ptrdiff_t diff = (b - a) * sizeof(Offset<Table>);
  FLATBUFFERS_ASSERT(diff >= 0);  // Guaranteed by SimpleQsort.
  auto udiff = static_cast<uoffset_t>(diff);
  a->o = EndianScalar(ReadScalar<uoffset_t>(a) - udiff);
  b->o = EndianScalar(ReadScalar<uoffset_t>(b) + udiff);
  std::swap(*a, *b);
}